

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O1

int Gia_ManOrderWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  
  pGVar5 = p->pObjs;
  if ((pObj < pGVar5) || (pGVar5 + p->nObjs <= pObj)) {
LAB_0077b1a2:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar2 = (int)((long)pObj - (long)pGVar5 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar2) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x23c,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar2] == p->nTravIds) {
    return 0;
  }
  p->pTravIds[iVar2] = p->nTravIds;
  uVar3 = (uint)*(undefined8 *)pObj;
  uVar4 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
  if ((~uVar3 & 0x9fffffff) == 0) {
    p->iData2 = uVar4 & 0x1fffffff;
    return 1;
  }
  if (((int)uVar3 < 0) || ((uVar3 & 0x1fffffff) == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                  ,0x10b,"int Gia_ManOrderWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
  }
  if (((-1 < (int)uVar3) && ((uVar3 & 0x1fffffff) != 0x1fffffff)) &&
     ((uVar3 & 0x1fffffff) == (uVar4 & 0x1fffffff))) {
    iVar2 = Gia_ManOrderWithBoxes_rec(p,pObj + -(ulong)(uVar3 & 0x1fffffff),vNodes);
    if (iVar2 != 0) {
      return 1;
    }
    pGVar5 = p->pObjs;
    if ((pObj < pGVar5) || (pGVar5 + p->nObjs <= pObj)) goto LAB_0077b1a2;
    iVar2 = (int)((ulong)((long)pObj - (long)pGVar5) >> 2) * -0x55555555;
    goto LAB_0077b18e;
  }
  if (pGVar5 + p->nObjs <= pObj) goto LAB_0077b1a2;
  piVar1 = p->pSibls;
  if ((piVar1 != (int *)0x0) && (piVar1[iVar2] != 0)) {
    if (piVar1 == (int *)0x0) {
LAB_0077b11e:
      pGVar5 = (Gia_Obj_t *)0x0;
    }
    else {
      uVar3 = piVar1[iVar2];
      if ((ulong)uVar3 == 0) goto LAB_0077b11e;
      if (((int)uVar3 < 0) || (p->nObjs <= (int)uVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar5 = pGVar5 + uVar3;
    }
    iVar2 = Gia_ManOrderWithBoxes_rec(p,pGVar5,vNodes);
    if (iVar2 != 0) {
      return 1;
    }
  }
  iVar2 = Gia_ManOrderWithBoxes_rec
                    (p,pObj + -(ulong)((uint)*(undefined8 *)pObj & 0x1fffffff),vNodes);
  if (iVar2 != 0) {
    return 1;
  }
  iVar2 = Gia_ManOrderWithBoxes_rec
                    (p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes);
  if (iVar2 != 0) {
    return 1;
  }
  iVar2 = Gia_ObjId(p,pObj);
LAB_0077b18e:
  Vec_IntPush(vNodes,iVar2);
  return 0;
}

Assistant:

int Gia_ManOrderWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        p->iData2 = Gia_ObjCioId(pObj);
        return 1;
    }
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjIsBuf(pObj) )
    {
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
            return 1;
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return 0;
    }
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), vNodes ) )
            return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin0(pObj), vNodes ) )
        return 1;
    if ( Gia_ManOrderWithBoxes_rec( p, Gia_ObjFanin1(pObj), vNodes ) )
        return 1;
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
    return 0;
}